

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool __thiscall ON_SubD::ReturnVertexForExperts(ON_SubD *this,ON_SubDVertex *v)

{
  ON_SubDimple *this_00;
  bool bVar1;
  
  if (v != (ON_SubDVertex *)0x0) {
    bVar1 = InSubD(this,v);
    if ((((bVar1) && ((v->super_ON_SubDComponentBase).m_id != 0)) &&
        ((v->super_ON_SubDComponentBase).m_archive_id != 0xffffffff)) &&
       (((v->m_edge_count == 0 && (v->m_face_count == 0)) &&
        (this_00 = (this->m_subdimple_sp).
                   super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
        this_00 != (ON_SubDimple *)0x0)))) {
      ON_SubDimple::ReturnVertex(this_00,v);
      bVar1 = true;
    }
    else {
      ON_SubDIncrementErrorCount();
      bVar1 = false;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool ON_SubD::ReturnVertexForExperts(
  ON_SubDVertex* v
)
{
  if (nullptr == v)
    return false;

  if (this->InSubD(v) && v->IsActive() && 0 == v->m_edge_count && 0 == v->m_face_count )
  {
    ON_SubDimple* subdimple = SubDimple(false);
    if (nullptr != subdimple)
    {
      subdimple->ReturnVertex(v);
      return true;
    }
  }

  // Caller is not an expert but a crash has been prevented.
  return ON_SUBD_RETURN_ERROR(false);
}